

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::forthscriptcpp_reset(Forth *this)

{
  SCell SVar1;
  pointer puVar2;
  SCell *pSVar3;
  long lVar4;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->executionStarted).__r = lVar4 / 1000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->dStack).stack,this->FORTHSCRIPTCPP_DSTACK_COUNT);
  (this->dStack).top = 0;
  puVar2 = (this->dStack).stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memset(puVar2,0,(long)(this->dStack).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->rStack).stack,this->FORTHSCRIPTCPP_RSTACK_COUNT);
  (this->rStack).top = 0;
  puVar2 = (this->rStack).stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memset(puVar2,0,(long)(this->rStack).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->returnStack).stack,0x1000);
  virtualMemoryInit(this);
  this->sourceid = 0;
  setNumericBase(this,10);
  setIsCompiling(this,this->False);
  setDataCell(this,this->VarOffsetBlkAddress,0);
  this->searchOrderCurrent = this->widForthWordList;
  this->searchOrderLast = this->widForthAssembler;
  std::vector<int,_std::allocator<int>_>::resize(&this->searchOrder,2);
  SVar1 = this->widForthWordList;
  pSVar3 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pSVar3 = SVar1;
  pSVar3[1] = SVar1;
  initializeDefinitions(this);
  return;
}

Assistant:

void forthscriptcpp_reset() {
			executionStarted = std::chrono::duration_cast< std::chrono::milliseconds >(
				std::chrono::system_clock::now().time_since_epoch() );
			dStack.resize(FORTHSCRIPTCPP_DSTACK_COUNT);
			dStack.resetStack();
			rStack.resize(FORTHSCRIPTCPP_RSTACK_COUNT);
			rStack.resetStack();
			// return stack init;
			returnStack.resize(4096);

			virtualMemoryInit();
			
			setSourceId(0); // SOURCE-ID=0: user input 
			setNumericBase(10); // BASE = 10
			setIsCompiling(False);
			setDataCell(VarOffsetBlkAddress, Cell(0)); // set BLK=0
			
			// search order setup
			searchOrderCurrent=widForthWordList;
			searchOrderLast=widForthAssembler;
			searchOrder.resize(2);
			searchOrder[0]=widForthWordList;
			searchOrder[1]=widForthWordList;
			initializeDefinitions();
		}